

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O0

cmStateSnapshot * __thiscall
cmState::CreateInlineListFileSnapshot
          (cmStateSnapshot *__return_storage_ptr__,cmState *this,cmStateSnapshot *originSnapshot,
          string *fileName)

{
  iterator it;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar1;
  PositionType PVar2;
  ReferenceType __src;
  PointerType pSVar3;
  PointerType pBVar4;
  PointerType pSVar5;
  long lVar6;
  undefined8 *puVar7;
  undefined8 *puVar8;
  byte bVar9;
  iterator it_00;
  SnapshotDataType in_stack_fffffffffffffd68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_128;
  PositionType PStack_120;
  iterator local_118;
  undefined8 local_108 [24];
  cmLinkedTree<cmStateDetail::SnapshotDataType> *local_48;
  PositionType PStack_40;
  undefined1 local_30 [8];
  PositionType pos;
  string *fileName_local;
  cmStateSnapshot *originSnapshot_local;
  cmState *this_local;
  
  bVar9 = 0;
  local_48 = (originSnapshot->Position).Tree;
  PStack_40 = (originSnapshot->Position).Position;
  pos.Position = (PositionType)fileName;
  __src = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator*
                    (&originSnapshot->Position);
  memcpy(local_108,__src,0xc0);
  PVar2 = PStack_40;
  pcVar1 = local_48;
  puVar7 = local_108;
  puVar8 = (undefined8 *)&stack0xfffffffffffffd68;
  for (lVar6 = 0x18; lVar6 != 0; lVar6 = lVar6 + -1) {
    *puVar8 = *puVar7;
    puVar7 = puVar7 + (ulong)bVar9 * -2 + 1;
    puVar8 = puVar8 + (ulong)bVar9 * -2 + 1;
  }
  it_00.Position = PVar2;
  it_00.Tree = pcVar1;
  _local_30 = cmLinkedTree<cmStateDetail::SnapshotDataType>::Push
                        (&this->SnapshotData,it_00,in_stack_fffffffffffffd68);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar3->SnapshotType = InlineListFileType;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar3->Keep = true;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  local_128 = (pSVar3->ExecutionListFile).Tree;
  PStack_120 = (pSVar3->ExecutionListFile).Position;
  std::__cxx11::string::string((string *)&local_148,(string *)pos.Position);
  it.Position = PStack_120;
  it.Tree = local_128;
  local_118 = cmLinkedTree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::Push(&this->ExecutionListFiles,it,&local_148);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pSVar3->ExecutionListFile = local_118;
  std::__cxx11::string::~string((string *)&local_148);
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  pBVar4 = cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType>::iterator::operator->
                     (&pSVar3->BuildSystemDirectory);
  (pBVar4->DirectoryEnd).Tree = (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_30;
  (pBVar4->DirectoryEnd).Position = (PositionType)pos.Tree;
  pSVar3 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->
                     (&originSnapshot->Position);
  pSVar5 = cmLinkedTree<cmStateDetail::SnapshotDataType>::iterator::operator->((iterator *)local_30)
  ;
  (pSVar5->PolicyScope).Tree = (pSVar3->Policies).Tree;
  (pSVar5->PolicyScope).Position = (pSVar3->Policies).Position;
  cmStateSnapshot::cmStateSnapshot(__return_storage_ptr__,this,_local_30);
  return __return_storage_ptr__;
}

Assistant:

cmStateSnapshot cmState::CreateInlineListFileSnapshot(
  cmStateSnapshot const& originSnapshot, std::string const& fileName)
{
  cmStateDetail::PositionType pos =
    this->SnapshotData.Push(originSnapshot.Position, *originSnapshot.Position);
  pos->SnapshotType = cmStateEnums::InlineListFileType;
  pos->Keep = true;
  pos->ExecutionListFile = this->ExecutionListFiles.Push(
    originSnapshot.Position->ExecutionListFile, fileName);
  pos->BuildSystemDirectory->DirectoryEnd = pos;
  pos->PolicyScope = originSnapshot.Position->Policies;
  return cmStateSnapshot(this, pos);
}